

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

bool Js::DateImplementation::TryParseMilliseconds
               (char16 *str,size_t length,size_t startIndex,int *value,size_t *foundDigits)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_54;
  unsigned_short d;
  ulong uStack_50;
  int v;
  size_t i;
  size_t allDigits;
  size_t minNumDigits;
  size_t *foundDigits_local;
  int *value_local;
  size_t startIndex_local;
  size_t length_local;
  char16 *str_local;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c1,"(str)","str");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c2,"(length)","length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c3,"(startIndex <= length)","startIndex <= length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length == startIndex) {
    str_local._7_1_ = false;
  }
  else {
    uStack_50 = 0;
    do {
      bVar2 = false;
      if (str[startIndex + uStack_50] == L'0') {
        uStack_50 = uStack_50 + 1;
        bVar2 = uStack_50 < length - startIndex;
      }
    } while (bVar2);
    local_54 = 0;
    while ((uStack_50 < length - startIndex && ((ushort)(str[startIndex + uStack_50] + L'￐') < 10)
           )) {
      if (uStack_50 < 3) {
        local_54 = local_54 * 10 + (uint)(ushort)(str[startIndex + uStack_50] + L'￐');
      }
      uStack_50 = uStack_50 + 1;
    }
    if (uStack_50 == 0) {
      str_local._7_1_ = false;
    }
    else {
      *foundDigits = uStack_50;
      if (*foundDigits == 1) {
        local_54 = local_54 * 100;
      }
      else if (*foundDigits == 2) {
        local_54 = local_54 * 10;
      }
      *value = local_54;
      bVar2 = false;
      if (uStack_50 < length - startIndex) {
        bVar2 = (ushort)(str[startIndex + uStack_50] + L'￐') < 10;
      }
      str_local._7_1_ = (bool)(bVar2 ^ 1);
    }
  }
  return str_local._7_1_;
}

Assistant:

bool DateImplementation::TryParseMilliseconds(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        int &value,
        size_t &foundDigits)
    {
        const size_t minNumDigits = 1;

        Assert(str);
        Assert(length);
        Assert(startIndex <= length);

        size_t allDigits = length - startIndex;
        if(allDigits < minNumDigits)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < allDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < allDigits ; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            if (i < 3) // not past the 3rd digit in the milliseconds, don't ignore
                v = v * 10 + d;
        }
        if(i < minNumDigits)
            return false;

        foundDigits = i;
        if (foundDigits == 1)
                v = v * 100;
        else if (foundDigits == 2)
                v = v * 10;

        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }